

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest16::initTest(FunctionalTest16 *this)

{
  GLuint *out_po_id;
  _shader_stage **this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLint GVar6;
  deUint32 err;
  undefined4 extraout_var;
  TestError *pTVar7;
  ulong uVar8;
  char *in_RSI;
  char *msg;
  long lVar9;
  uint uVar10;
  uint local_30c;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  undefined1 local_2f8 [12];
  uint local_2ec;
  _item items [10];
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  string vs_body;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  local_2f8._0_8_ = this->m_pipeline_object_ids;
  uVar10 = 0;
  do {
    if (1 < uVar10) {
      return;
    }
    items[0].po_id = 4;
    local_30c = uVar10;
    getShaderBody_abi_cxx11_(&fs_body,(FunctionalTest16 *)in_RSI,&items[0].po_id,&local_30c);
    items[0].po_id = 3;
    getShaderBody_abi_cxx11_(&gs_body,(FunctionalTest16 *)in_RSI,&items[0].po_id,&local_30c);
    items[0].po_id = 1;
    getShaderBody_abi_cxx11_(&tc_body,(FunctionalTest16 *)in_RSI,&items[0].po_id,&local_30c);
    items[0].po_id = 2;
    getShaderBody_abi_cxx11_(&te_body,(FunctionalTest16 *)in_RSI,&items[0].po_id,&local_30c);
    items[0].po_id = 0;
    getShaderBody_abi_cxx11_(&vs_body,(FunctionalTest16 *)in_RSI,&items[0].po_id,&local_30c);
    items[0]._0_8_ = (ulong)(uint)items[0]._4_4_ << 0x20;
    uVar8 = (ulong)uVar10;
    out_po_id = this->m_po_ids + uVar8;
    local_2ec = uVar10;
    bVar2 = Utils::buildProgram(gl,&vs_body,&tc_body,&te_body,&gs_body,&fs_body,(GLchar **)0x0,
                                &items[0].po_id,this->m_vs_ids + uVar8,this->m_tc_ids + uVar8,
                                this->m_te_ids + uVar8,this->m_gs_ids + uVar8,this->m_fs_ids + uVar8
                                ,out_po_id);
    if (!bVar2) {
      items[0]._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = &items[0].stage;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"Failed to build test program object, index:[");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"]");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)items,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Failed to build a test program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x2025);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (this->m_are_pipeline_objects_supported == true) {
      fs_body_raw_ptr = fs_body._M_dataplus._M_p;
      items[0].so_id = 0;
      gs_body_raw_ptr = gs_body._M_dataplus._M_p;
      items[0].po_id = 0;
      items[0]._4_4_ = 0;
      items[0].stage = (_shader_stage *)0x0;
      tc_body_raw_ptr = tc_body._M_dataplus._M_p;
      te_body_raw_ptr = te_body._M_dataplus._M_p;
      vs_body_raw_ptr = vs_body._M_dataplus._M_p;
      GVar4 = (*gl->createShaderProgramv)(0x8b30,1,&fs_body_raw_ptr);
      this->m_fs_po_ids[uVar8] = GVar4;
      GVar4 = (*gl->createShaderProgramv)(0x8dd9,1,&gs_body_raw_ptr);
      this->m_gs_po_ids[uVar8] = GVar4;
      GVar4 = (*gl->createShaderProgramv)(0x8e88,1,&tc_body_raw_ptr);
      this->m_tc_po_ids[uVar8] = GVar4;
      GVar4 = (*gl->createShaderProgramv)(0x8e87,1,&te_body_raw_ptr);
      this->m_te_po_ids[uVar8] = GVar4;
      GVar4 = (*gl->createShaderProgramv)(0x8b31,1,&vs_body_raw_ptr);
      this->m_vs_po_ids[uVar8] = GVar4;
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glCreateShaderProgramv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2037);
      (*gl->getProgramiv)(this->m_fs_po_ids[uVar8],0x8b82,(GLint *)items);
      (*gl->getProgramiv)(this->m_gs_po_ids[uVar8],0x8b82,(GLint *)&items[0].field_0x4);
      (*gl->getProgramiv)(this->m_tc_po_ids[uVar8],0x8b82,(GLint *)&items[0].stage);
      (*gl->getProgramiv)(this->m_te_po_ids[uVar8],0x8b82,(GLint *)((long)&items[0].stage + 4));
      (*gl->getProgramiv)(this->m_vs_po_ids[uVar8],0x8b82,(GLint *)&items[0].so_id);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x203e);
      if (items[0].po_id == 0) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Fragment shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2041);
LAB_00a1e016:
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (items[0]._4_4_ == 0) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Geometry shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2043);
        goto LAB_00a1e016;
      }
      if ((int)items[0].stage == 0) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Tessellation control shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2045);
        goto LAB_00a1e016;
      }
      if (items[0].stage._4_4_ == 0) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Tessellation evaluation shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2047);
        goto LAB_00a1e016;
      }
      if (items[0].so_id == 0) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Vertex shader program failed to link",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2049);
        goto LAB_00a1e016;
      }
      (*gl->genProgramPipelines)(1,(GLuint *)((long)(Platform **)local_2f8._0_8_ + uVar8 * 4));
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGenProgramPipelines() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x204d);
      (*gl->useProgramStages)(this->m_pipeline_object_ids[uVar8],2,this->m_fs_po_ids[uVar8]);
      (*gl->useProgramStages)(this->m_pipeline_object_ids[uVar8],4,this->m_gs_po_ids[uVar8]);
      (*gl->useProgramStages)(this->m_pipeline_object_ids[uVar8],8,this->m_tc_po_ids[uVar8]);
      (*gl->useProgramStages)(this->m_pipeline_object_ids[uVar8],0x10,this->m_te_po_ids[uVar8]);
      (*gl->useProgramStages)(this->m_pipeline_object_ids[uVar8],1,this->m_vs_po_ids[uVar8]);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glUseProgramStages() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2054);
    }
    items[1].po_id = this->m_po_ids[uVar8];
    items[0].po_id = items[1].po_id;
    items[0].stage = &this->m_po_descriptors[uVar8].fragment;
    items[0].so_id = this->m_fs_ids[uVar8];
    items[0].so_type = 0x8b30;
    items[1].stage = &this->m_po_descriptors[uVar8].geometry;
    items[1].so_id = this->m_gs_ids[uVar8];
    items[1].so_type = 0x8dd9;
    items[2].po_id = items[1].po_id;
    items[2].stage = &this->m_po_descriptors[uVar8].tess_control;
    items[2].so_id = this->m_tc_ids[uVar8];
    items[2].so_type = 0x8e88;
    items[3].po_id = items[1].po_id;
    items[3].stage = &this->m_po_descriptors[uVar8].tess_evaluation;
    items[3].so_id = this->m_te_ids[uVar8];
    items[3].so_type = 0x8e87;
    items[4].po_id = items[1].po_id;
    items[4].stage = &this->m_po_descriptors[uVar8].vertex;
    items[4].so_id = this->m_vs_ids[uVar8];
    items[4].so_type = 0x8b31;
    items[5].po_id = this->m_fs_po_ids[uVar8];
    items[5].stage = this->m_fs_po_descriptors + uVar8;
    items[5].so_id = this->m_fs_po_ids[uVar8];
    items[5].so_type = 0x8b30;
    items[6].po_id = this->m_gs_po_ids[uVar8];
    items[6].stage = this->m_gs_po_descriptors + uVar8;
    items[6].so_id = this->m_gs_po_ids[uVar8];
    items[6].so_type = 0x8dd9;
    items[7].po_id = this->m_tc_po_ids[uVar8];
    items[7].stage = this->m_tc_po_descriptors + uVar8;
    items[7].so_id = this->m_tc_po_ids[uVar8];
    items[7].so_type = 0x8e88;
    items[8].po_id = this->m_te_po_ids[uVar8];
    items[8].stage = this->m_te_po_descriptors + uVar8;
    items[8].so_id = this->m_te_po_ids[uVar8];
    items[8].so_type = 0x8e87;
    items[9].po_id = this->m_vs_po_ids[uVar8];
    items[9].stage = this->m_vs_po_descriptors + uVar8;
    items[9].so_id = this->m_vs_po_ids[uVar8];
    items[9].so_type = 0x8b31;
    for (lVar9 = 0x14; lVar9 != 0x104; lVar9 = lVar9 + 0x18) {
      GVar4 = (*gl->getSubroutineIndex)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"function1");
      *(GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x20) = GVar4;
      GVar4 = (*gl->getSubroutineIndex)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"function2");
      *(GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x24) = GVar4;
      GVar4 = (*gl->getSubroutineIndex)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"function3");
      *(GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x28) = GVar4;
      GVar4 = (*gl->getSubroutineIndex)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"function4");
      *(GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x2c) = GVar4;
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGetSubroutineIndex() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x2079);
      lVar1 = *(long *)(local_2f8 + lVar9 + 4);
      if ((((*(int *)(lVar1 + 0x20) == -1) || (*(int *)(lVar1 + 0x24) == -1)) ||
          (*(int *)(lVar1 + 0x28) == -1)) || (*(int *)(lVar1 + 0x2c) == -1)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Subroutine name was not recognized.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2080);
LAB_00a1de8e:
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar6 = (*gl->getSubroutineUniformLocation)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"subroutine1");
      *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x10) = GVar6;
      GVar6 = (*gl->getSubroutineUniformLocation)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"subroutine2");
      *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x14) = GVar6;
      GVar6 = (*gl->getSubroutineUniformLocation)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"subroutine3");
      *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x18) = GVar6;
      GVar6 = (*gl->getSubroutineUniformLocation)
                        (*(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4),
                         *(GLenum *)((long)&items[0].po_id + lVar9),"subroutine4");
      *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x1c) = GVar6;
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGetSubroutineUniformLocation() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x208b);
      lVar1 = *(long *)(local_2f8 + lVar9 + 4);
      if (((*(int *)(lVar1 + 0x10) == -1) || (*(int *)(lVar1 + 0x14) == -1)) ||
         ((*(int *)(lVar1 + 0x18) == -1 || (*(int *)(lVar1 + 0x1c) == -1)))) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Subroutine uniform name was not recognized.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x2092);
        goto LAB_00a1de8e;
      }
      if (*out_po_id == *(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4)) {
        (*gl->useProgram)(*out_po_id);
        err = (*gl->getError)();
        iVar3 = 0x2098;
        msg = "glUseProgram() call failed.";
      }
      else {
        (*gl->bindProgramPipeline)(*(GLuint *)((long)(Platform **)local_2f8._0_8_ + uVar8 * 4));
        err = (*gl->getError)();
        iVar3 = 0x209e;
        msg = "glBindProgramPipeline() call failed.";
      }
      glu::checkError(err,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,iVar3);
      (*gl->getUniformSubroutineuiv)
                (*(GLenum *)((long)&items[0].po_id + lVar9),(*(GLuint **)(local_2f8 + lVar9 + 4))[4]
                 ,*(GLuint **)(local_2f8 + lVar9 + 4));
      (*gl->getUniformSubroutineuiv)
                (*(GLenum *)((long)&items[0].po_id + lVar9),
                 *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x14),
                 (GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 4));
      (*gl->getUniformSubroutineuiv)
                (*(GLenum *)((long)&items[0].po_id + lVar9),
                 *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x18),
                 (GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 8));
      (*gl->getUniformSubroutineuiv)
                (*(GLenum *)((long)&items[0].po_id + lVar9),
                 *(GLint *)(*(long *)(local_2f8 + lVar9 + 4) + 0x1c),
                 (GLuint *)(*(long *)(local_2f8 + lVar9 + 4) + 0xc));
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glGetUniformSubroutineuiv() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20a9);
      *(undefined4 *)(*(long *)(local_2f8 + lVar9 + 4) + 0x30) =
           *(undefined4 *)((long)&items[0].po_id + lVar9);
      if (*out_po_id != *(GLuint *)((long)&fs_body_raw_ptr + lVar9 + 4)) {
        (*gl->bindProgramPipeline)(0);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"glBindProgramPipeline() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x20b1);
      }
    }
    fs_body_raw_ptr = (char *)((ulong)fs_body_raw_ptr & 0xffffffff00000000);
    gs_body_raw_ptr = (char *)CONCAT44(gs_body_raw_ptr._4_4_,2);
    in_RSI = (char *)&fs_body_raw_ptr;
    verifySubroutineUniformValues
              (this,(_test_case *)in_RSI,&local_30c,
               (_subroutine_uniform_value_verification *)&gs_body_raw_ptr);
    uVar10 = local_2ec;
    if (this->m_are_pipeline_objects_supported == true) {
      (*gl->useProgram)(0);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20bd);
      (*gl->bindProgramPipeline)(*(GLuint *)((long)(Platform **)local_2f8._0_8_ + uVar8 * 4));
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"glBindProgramPipeline() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20c0);
      fs_body_raw_ptr = (char *)CONCAT44(fs_body_raw_ptr._4_4_,1);
      gs_body_raw_ptr = (char *)CONCAT44(gs_body_raw_ptr._4_4_,2);
      verifySubroutineUniformValues
                (this,(_test_case *)&fs_body_raw_ptr,&local_30c,
                 (_subroutine_uniform_value_verification *)&gs_body_raw_ptr);
      (*gl->bindProgramPipeline)(0);
      GVar5 = (*gl->getError)();
      in_RSI = "glBindProgramPipeline() call failed.";
      glu::checkError(GVar5,"glBindProgramPipeline() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x20c7);
    }
    std::__cxx11::string::~string((string *)&vs_body);
    std::__cxx11::string::~string((string *)&te_body);
    std::__cxx11::string::~string((string *)&tc_body);
    std::__cxx11::string::~string((string *)&gs_body);
    std::__cxx11::string::~string((string *)&fs_body);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void FunctionalTest16::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_id = 0; n_id < 2 /* test program/shader objects */; ++n_id)
	{
		const std::string fs_body = getShaderBody(Utils::SHADER_STAGE_FRAGMENT, n_id);
		const std::string gs_body = getShaderBody(Utils::SHADER_STAGE_GEOMETRY, n_id);
		const std::string tc_body = getShaderBody(Utils::SHADER_STAGE_TESSELLATION_CONTROL, n_id);
		const std::string te_body = getShaderBody(Utils::SHADER_STAGE_TESSELLATION_EVALUATION, n_id);
		const std::string vs_body = getShaderBody(Utils::SHADER_STAGE_VERTEX, n_id);

		if (!Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, DE_NULL, /* xfb_varyings */
								 DE_NULL,												   /* n_xfb_varyings */
								 m_vs_ids + n_id, m_tc_ids + n_id, m_te_ids + n_id, m_gs_ids + n_id, m_fs_ids + n_id,
								 m_po_ids + n_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to build test program object, index:"
														   "["
							   << n_id << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL("Failed to build a test program");
		}

		if (m_are_pipeline_objects_supported)
		{
			/* Initialize shader program objects */
			const char* fs_body_raw_ptr = fs_body.c_str();
			const char* gs_body_raw_ptr = gs_body.c_str();
			glw::GLint  link_status[5]  = { GL_FALSE };
			const char* tc_body_raw_ptr = tc_body.c_str();
			const char* te_body_raw_ptr = te_body.c_str();
			const char* vs_body_raw_ptr = vs_body.c_str();

			m_fs_po_ids[n_id] = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1 /* count */, &fs_body_raw_ptr);
			m_gs_po_ids[n_id] = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1 /* count */, &gs_body_raw_ptr);
			m_tc_po_ids[n_id] = gl.createShaderProgramv(GL_TESS_CONTROL_SHADER, 1 /* count */, &tc_body_raw_ptr);
			m_te_po_ids[n_id] = gl.createShaderProgramv(GL_TESS_EVALUATION_SHADER, 1 /* count */, &te_body_raw_ptr);
			m_vs_po_ids[n_id] = gl.createShaderProgramv(GL_VERTEX_SHADER, 1 /* count */, &vs_body_raw_ptr);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

			gl.getProgramiv(m_fs_po_ids[n_id], GL_LINK_STATUS, link_status + 0);
			gl.getProgramiv(m_gs_po_ids[n_id], GL_LINK_STATUS, link_status + 1);
			gl.getProgramiv(m_tc_po_ids[n_id], GL_LINK_STATUS, link_status + 2);
			gl.getProgramiv(m_te_po_ids[n_id], GL_LINK_STATUS, link_status + 3);
			gl.getProgramiv(m_vs_po_ids[n_id], GL_LINK_STATUS, link_status + 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			if (link_status[0] == GL_FALSE)
				TCU_FAIL("Fragment shader program failed to link");
			if (link_status[1] == GL_FALSE)
				TCU_FAIL("Geometry shader program failed to link");
			if (link_status[2] == GL_FALSE)
				TCU_FAIL("Tessellation control shader program failed to link");
			if (link_status[3] == GL_FALSE)
				TCU_FAIL("Tessellation evaluation shader program failed to link");
			if (link_status[4] == GL_FALSE)
				TCU_FAIL("Vertex shader program failed to link");

			/* Initialize pipeline program object */
			gl.genProgramPipelines(1 /* n */, m_pipeline_object_ids + n_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_FRAGMENT_SHADER_BIT, m_fs_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_GEOMETRY_SHADER_BIT, m_gs_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_TESS_CONTROL_SHADER_BIT, m_tc_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_TESS_EVALUATION_SHADER_BIT, m_te_po_ids[n_id]);
			gl.useProgramStages(m_pipeline_object_ids[n_id], GL_VERTEX_SHADER_BIT, m_vs_po_ids[n_id]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");
		}

		/* Retrieve subroutine locations */
		struct _item
		{
			glw::GLuint	po_id;
			_shader_stage& stage;
			glw::GLuint	so_id;
			glw::GLenum	so_type;
		} items[] = {
			{ m_po_ids[n_id], m_po_descriptors[n_id].fragment, m_fs_ids[n_id], GL_FRAGMENT_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].geometry, m_gs_ids[n_id], GL_GEOMETRY_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].tess_control, m_tc_ids[n_id], GL_TESS_CONTROL_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].tess_evaluation, m_te_ids[n_id], GL_TESS_EVALUATION_SHADER },
			{ m_po_ids[n_id], m_po_descriptors[n_id].vertex, m_vs_ids[n_id], GL_VERTEX_SHADER },

			{ m_fs_po_ids[n_id], m_fs_po_descriptors[n_id], m_fs_po_ids[n_id], GL_FRAGMENT_SHADER },
			{ m_gs_po_ids[n_id], m_gs_po_descriptors[n_id], m_gs_po_ids[n_id], GL_GEOMETRY_SHADER },
			{ m_tc_po_ids[n_id], m_tc_po_descriptors[n_id], m_tc_po_ids[n_id], GL_TESS_CONTROL_SHADER },
			{ m_te_po_ids[n_id], m_te_po_descriptors[n_id], m_te_po_ids[n_id], GL_TESS_EVALUATION_SHADER },
			{ m_vs_po_ids[n_id], m_vs_po_descriptors[n_id], m_vs_po_ids[n_id], GL_VERTEX_SHADER },
		};
		const unsigned int n_items = sizeof(items) / sizeof(items[0]);

		for (unsigned int n_item = 0; n_item < n_items; ++n_item)
		{
			_item& current_item = items[n_item];

			current_item.stage.function1_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function1");
			current_item.stage.function2_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function2");
			current_item.stage.function3_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function3");
			current_item.stage.function4_index =
				gl.getSubroutineIndex(current_item.po_id, current_item.so_type, "function4");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

			if (current_item.stage.function1_index == GL_INVALID_INDEX ||
				current_item.stage.function2_index == GL_INVALID_INDEX ||
				current_item.stage.function3_index == GL_INVALID_INDEX ||
				current_item.stage.function4_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Subroutine name was not recognized.");
			}

			current_item.stage.subroutine1_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine1");
			current_item.stage.subroutine2_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine2");
			current_item.stage.subroutine3_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine3");
			current_item.stage.subroutine4_uniform_location =
				gl.getSubroutineUniformLocation(current_item.po_id, current_item.so_type, "subroutine4");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call(s) failed.");

			if (current_item.stage.subroutine1_uniform_location == -1 ||
				current_item.stage.subroutine2_uniform_location == -1 ||
				current_item.stage.subroutine3_uniform_location == -1 ||
				current_item.stage.subroutine4_uniform_location == -1)
			{
				TCU_FAIL("Subroutine uniform name was not recognized.");
			}

			if (m_po_ids[n_id] == current_item.po_id)
			{
				gl.useProgram(current_item.po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
			}
			else
			{
				/* Temporarily bind the program pipeline. */
				gl.bindProgramPipeline(m_pipeline_object_ids[n_id]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
			}

			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine1_uniform_location,
									   &current_item.stage.default_subroutine1_value);
			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine2_uniform_location,
									   &current_item.stage.default_subroutine2_value);
			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine3_uniform_location,
									   &current_item.stage.default_subroutine3_value);
			gl.getUniformSubroutineuiv(current_item.so_type, current_item.stage.subroutine4_uniform_location,
									   &current_item.stage.default_subroutine4_value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformSubroutineuiv() call(s) failed.");

			current_item.stage.gl_stage = current_item.so_type;

			if (m_po_ids[n_id] != current_item.po_id)
			{
				/* Unbind the program pipeline object */
				gl.bindProgramPipeline(0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
			}
		} /* for (all items) */

		/* Make sure the default subroutine choices are valid. */
		verifySubroutineUniformValues(
			TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_OBJECT, /* makes the verification routine use program object descriptor */
			n_id, SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES);

		if (m_are_pipeline_objects_supported)
		{
			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			gl.bindProgramPipeline(m_pipeline_object_ids[n_id]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
			{
				verifySubroutineUniformValues(
					TEST_CASE_SWITCH_TO_DIFFERENT_PROGRAM_PIPELINE_OBJECT, /* makes the verification routine use pipeline object descriptor */
					n_id, SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES);
			}
			gl.bindProgramPipeline(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");
		}
	} /* for (both program descriptors) */
}